

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

AssertionResult __thiscall testing::AssertionResult::operator!(AssertionResult *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  byte *in_RSI;
  AssertionResult AVar3;
  bool local_1a [10];
  AssertionResult *this_local;
  AssertionResult *negation;
  
  local_1a[1] = false;
  local_1a[0] = (bool)(~*in_RSI & 1);
  this_local = this;
  AssertionResult<bool>(this,local_1a,(type *)0x0);
  pbVar1 = internal::
           scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 8));
  sVar2.ptr_ = extraout_RDX;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(in_RSI + 8));
    operator<<(this,pbVar1);
    sVar2.ptr_ = extraout_RDX_00;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult AssertionResult::operator!() const {
  AssertionResult negation(!success_);
  if (message_.get() != NULL)
    negation << *message_;
  return negation;
}